

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O3

btScalar __thiscall
btHingeConstraint::getHingeAngle(btHingeConstraint *this,btTransform *transA,btTransform *transB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar17 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
  fVar1 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
  fVar2 = (transA->m_basis).m_el[0].m_floats[0];
  fVar3 = (transA->m_basis).m_el[0].m_floats[1];
  fVar4 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[0];
  fVar5 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[1];
  fVar6 = (transA->m_basis).m_el[0].m_floats[2];
  fVar7 = (transA->m_basis).m_el[1].m_floats[0];
  fVar8 = (transA->m_basis).m_el[1].m_floats[1];
  fVar9 = (transA->m_basis).m_el[2].m_floats[0];
  fVar10 = (transA->m_basis).m_el[2].m_floats[1];
  fVar11 = (transA->m_basis).m_el[2].m_floats[2];
  fVar12 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
  fVar13 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
  fVar14 = (transA->m_basis).m_el[1].m_floats[2];
  fVar18 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[1];
  fVar15 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[1];
  fVar16 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[1];
  fVar20 = (transB->m_basis).m_el[0].m_floats[2] * fVar16 +
           (transB->m_basis).m_el[0].m_floats[0] * fVar18 +
           (transB->m_basis).m_el[0].m_floats[1] * fVar15;
  fVar19 = fVar16 * (transB->m_basis).m_el[1].m_floats[2] +
           fVar18 * (transB->m_basis).m_el[1].m_floats[0] +
           (transB->m_basis).m_el[1].m_floats[1] * fVar15;
  fVar18 = fVar16 * (transB->m_basis).m_el[2].m_floats[2] +
           fVar18 * (transB->m_basis).m_el[2].m_floats[0] +
           fVar15 * (transB->m_basis).m_el[2].m_floats[1];
  fVar17 = atan2f((fVar11 * fVar1 + fVar9 * fVar4 + fVar17 * fVar10) * fVar18 +
                  (fVar6 * fVar1 + fVar2 * fVar4 + fVar17 * fVar3) * fVar20 +
                  (fVar1 * fVar14 + fVar4 * fVar7 + fVar8 * fVar17) * fVar19,
                  fVar18 * (fVar11 * fVar13 + fVar9 * fVar5 + fVar10 * fVar12) +
                  fVar20 * (fVar6 * fVar13 + fVar2 * fVar5 + fVar3 * fVar12) +
                  fVar19 * (fVar14 * fVar13 + fVar7 * fVar5 + fVar8 * fVar12));
  return fVar17 * this->m_referenceSign;
}

Assistant:

btScalar btHingeConstraint::getHingeAngle(const btTransform& transA,const btTransform& transB)
{
	const btVector3 refAxis0  = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
	const btVector3 refAxis1  = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
	const btVector3 swingAxis = transB.getBasis() * m_rbBFrame.getBasis().getColumn(1);
//	btScalar angle = btAtan2Fast(swingAxis.dot(refAxis0), swingAxis.dot(refAxis1));
	btScalar angle = btAtan2(swingAxis.dot(refAxis0), swingAxis.dot(refAxis1));
	return m_referenceSign * angle;
}